

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

bool __thiscall units::measurement::operator<=(measurement *this,measurement *other)

{
  double dVar1;
  bool local_29;
  double val;
  measurement *other_local;
  measurement *this_local;
  
  dVar1 = value_as(other,&this->units_);
  if (dVar1 < this->value_) {
    local_29 = detail::compare_round_equals((float)this->value_,(float)dVar1);
  }
  else {
    local_29 = true;
  }
  return local_29;
}

Assistant:

bool operator<=(const measurement& other) const
    {
        auto val = other.value_as(units_);
        return (value_ <= val) ?
            true :
            detail::compare_round_equals(
                static_cast<float>(value_), static_cast<float>(val));
    }